

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_go.cpp
# Opt level: O0

string * __thiscall
flatbuffers::go::GoGenerator::GenTypeGet_abi_cxx11_
          (string *__return_storage_ptr__,GoGenerator *this,Type *type)

{
  bool bVar1;
  Type *type_local;
  GoGenerator *this_local;
  
  if (type->enum_def == (EnumDef *)0x0) {
    bVar1 = IsScalar(type->base_type);
    if (bVar1) {
      GenTypeBasic_abi_cxx11_(__return_storage_ptr__,this,type);
    }
    else {
      GenTypePointer_abi_cxx11_(__return_storage_ptr__,this,type);
    }
  }
  else {
    GetEnumTypeName_abi_cxx11_(__return_storage_ptr__,this,type->enum_def);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GenTypeGet(const Type &type) {
    if (type.enum_def != nullptr) { return GetEnumTypeName(*type.enum_def); }
    return IsScalar(type.base_type) ? GenTypeBasic(type) : GenTypePointer(type);
  }